

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsCreators.cpp
# Opt level: O2

void chrono::utils::AddSphereGeometry
               (ChBody *body,shared_ptr<chrono::ChMaterialSurface> *material,double radius,
               ChVector<double> *pos,ChQuaternion<double> *rot,bool visualization,
               shared_ptr<chrono::ChVisualMaterial> *vis_material)

{
  _func_int **pp_Var1;
  shared_ptr<chrono::ChSphereShape> sphere;
  shared_ptr<chrono::ChVisualModel> model;
  shared_ptr<chrono::ChVisualShape> local_118;
  undefined1 local_108 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f0;
  __shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2> local_e8;
  __shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2> local_d8;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_c8;
  ChFrame<double> local_b8;
  
  std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
             &local_b8,
             &(body->collision_model).
              super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>);
  pp_Var1 = local_b8._vptr_ChFrame;
  std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_c8,
             &material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
  (*(code *)(((__shared_ptr<chrono::ChCamera,_(__gnu_cxx::_Lock_policy)2> *)pp_Var1)->_M_ptr->
            aimpoint).m_data[1])(radius,pp_Var1,&local_c8,pos);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b8.coord);
  if (visualization) {
    ChPhysicsItem::GetVisualModel((ChPhysicsItem *)&local_b8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b8.coord);
    if ((pointer)local_b8._vptr_ChFrame == (pointer)0x0) {
      std::make_shared<chrono::ChVisualModel>();
      std::__shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_d8,
                 (__shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2> *)&local_b8);
      ChPhysicsItem::AddVisualModel
                (&body->super_ChPhysicsItem,(shared_ptr<chrono::ChVisualModel> *)&local_d8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d8._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b8.coord);
    }
    chrono_types::make_shared<chrono::ChSphereShape,_0>();
    *(double *)&((ChVisualShape *)(local_108._16_8_ + 0x28))->visible = radius;
    std::__shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_e8,
               &vis_material->
                super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>);
    ChVisualShape::AddMaterial
              ((ChVisualShape *)local_108._16_8_,(shared_ptr<chrono::ChVisualMaterial> *)&local_e8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e8._M_refcount);
    ChPhysicsItem::GetVisualModel((ChPhysicsItem *)local_108);
    std::__shared_ptr<chrono::ChVisualShape,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<chrono::ChSphereShape,void>
              ((__shared_ptr<chrono::ChVisualShape,(__gnu_cxx::_Lock_policy)2> *)&local_118,
               (__shared_ptr<chrono::ChSphereShape,_(__gnu_cxx::_Lock_policy)2> *)(local_108 + 0x10)
              );
    ChFrame<double>::ChFrame(&local_b8,pos,rot);
    ChVisualModel::AddShape((ChVisualModel *)local_108._0_8_,&local_118,&local_b8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_118.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_108 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f0);
  }
  return;
}

Assistant:

void AddSphereGeometry(ChBody* body,
                       std::shared_ptr<ChMaterialSurface> material,
                       double radius,
                       const ChVector<>& pos,
                       const ChQuaternion<>& rot,
                       bool visualization,
                       std::shared_ptr<ChVisualMaterial> vis_material) {
    body->GetCollisionModel()->AddSphere(material, radius, pos);

    if (visualization) {
        if (!body->GetVisualModel()) {
            auto model = chrono_types::make_shared<ChVisualModel>();
            body->AddVisualModel(model);
        }
        auto sphere = chrono_types::make_shared<ChSphereShape>();
        sphere->GetSphereGeometry().rad = radius;
        sphere->AddMaterial(vis_material);
        body->GetVisualModel()->AddShape(sphere, ChFrame<>(pos, rot));
    }
}